

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Gia_Man_t * Mf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  char *pcVar3;
  Jf_Par_t *pJVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *pGVar8;
  Mf_Man_t *p;
  FILE *__stream;
  Gia_Man_t *p_00;
  Cnf_Dat_t *pCVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  word *pwVar14;
  long lVar15;
  char pFileName [1000];
  char local_418 [1000];
  
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
  }
  pGVar8 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar8 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  p = Mf_ManAlloc(pGVar8,pPars);
  p->pGia0 = pGia;
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar8);
    putchar(10);
  }
  Mf_ManPrintInit(p);
  Mf_ManComputeCuts(p);
  p->Iter = 1;
  iVar7 = p->pPars->nRounds;
  iVar6 = 1;
  if (1 < iVar7) {
    do {
      Mf_ManComputeMapping(p);
      iVar6 = p->Iter + 1;
      p->Iter = iVar6;
      iVar7 = p->pPars->nRounds;
    } while (iVar6 < iVar7);
  }
  p->fUseEla = 1;
  if (iVar6 < iVar7 + pPars->nRoundsEla) {
    do {
      Mf_ManComputeMapping(p);
      iVar7 = p->Iter + 1;
      p->Iter = iVar7;
    } while (iVar7 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    pVVar2 = p->vTtMem;
    pcVar3 = p->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar3);
    __stream = _stdout;
    if ((pcVar3 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar2->nEntries);
    }
    uVar12 = (ulong)(uint)pVVar2->nEntries;
    if ((0 < pVVar2->nEntries) && (pwVar14 = *pVVar2->ppPages, pwVar14 != (word *)0x0)) {
      uVar11 = pVVar2->nEntrySize;
      uVar13 = 0;
      do {
        if (0 < (int)uVar11) {
          uVar12 = (ulong)uVar11;
          do {
            lVar15 = 0x3c;
            do {
              uVar11 = (uint)(pwVar14[uVar12 - 1] >> ((byte)lVar15 & 0x3f)) & 0xf;
              if (uVar11 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar11 + 0x37,__stream);
              }
              lVar15 = lVar15 + -4;
            } while (lVar15 != -4);
            bVar5 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar5);
        }
        fputc(10,__stream);
        uVar13 = uVar13 + 1;
        uVar12 = (ulong)(uint)pVVar2->nEntries;
        if (pVVar2->nEntries <= (int)uVar13) break;
        uVar11 = pVVar2->nEntrySize;
        pwVar14 = pVVar2->ppPages[uVar13 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                  (int)((pVVar2->PageMask & uVar13) * uVar11);
      } while (pVVar2->ppPages[uVar13 >> ((byte)pVVar2->LogPageSze & 0x1f)] != (word *)0x0);
    }
    if (__stream != _stdout) {
      fclose(__stream);
      uVar12 = (ulong)(uint)pVVar2->nEntries;
    }
    pcVar10 = local_418;
    if (pcVar3 == (char *)0x0) {
      pcVar10 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar2->nEntrySize * (double)(int)uVar12 * 8.0 * 9.5367431640625e-07,uVar12,
           (ulong)uVar1,pcVar10);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_00 = Mf_ManDeriveMapping(p);
    }
    else {
      p_00 = Mf_ManDeriveMappingCoarse(p);
    }
  }
  else {
    p_00 = Mf_ManDeriveMappingGia(p);
  }
  pJVar4 = p->pPars;
  if (pJVar4->fGenCnf != 0) {
    pCVar9 = Mf_ManDeriveCnf(p,pJVar4->fCnfObjIds,pJVar4->fAddOrCla);
    pGia->pData = pCVar9;
  }
  Gia_ManMappingVerify(p_00);
  Mf_ManPrintQuit(p,p_00);
  Mf_ManFree(p);
  if (pGVar8 != pGia) {
    Gia_ManStop(pGVar8);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Mf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCutMin = 1, pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Mf_ManAlloc( pCls, pPars );
    p->pGia0 = pGia;
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Mf_ManPrintInit( p );
    Mf_ManComputeCuts( p );
    for ( p->Iter = 1; p->Iter < p->pPars->nRounds; p->Iter++ )
        Mf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Mf_ManComputeMapping( p );
    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Mf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Mf_ManDeriveMappingCoarse( p );
    else
        pNew = Mf_ManDeriveMapping( p );
    if ( p->pPars->fGenCnf )
        pGia->pData = Mf_ManDeriveCnf( p, p->pPars->fCnfObjIds, p->pPars->fAddOrCla );
//    if ( p->pPars->fGenCnf )
//        Mf_ManProfileTruths( p );
    Gia_ManMappingVerify( pNew );
    Mf_ManPrintQuit( p, pNew );
    Mf_ManFree( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    return pNew;
}